

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locavailable.cpp
# Opt level: O2

void loadInstalledLocales(void)

{
  UBool UVar1;
  int32_t iVar2;
  UResourceBundle *resB;
  long lVar3;
  ulong uVar4;
  UErrorCode status;
  UResourceBundle installed;
  
  status = U_ZERO_ERROR;
  _installedLocalesCount = 0;
  ures_initStackObject_63(&installed);
  resB = ures_openDirect_63((char *)0x0,"res_index",&status);
  ures_getByKey_63(resB,"InstalledLocales",&installed,&status);
  if (status < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar2 = ures_getSize_63(&installed);
    _installedLocales = (char **)uprv_malloc_63((long)iVar2 * 8 + 8);
    if (_installedLocales != (char **)0x0) {
      ures_resetIterator_63(&installed);
      lVar3 = 0;
      uVar4 = 0;
      while( true ) {
        UVar1 = ures_hasNext_63(&installed);
        if (UVar1 == '\0') break;
        uVar4 = uVar4 + 1;
        ures_getNextString_63
                  (&installed,(int32_t *)0x0,(char **)((long)_installedLocales + lVar3),&status);
        lVar3 = lVar3 + 8;
      }
      _installedLocales[uVar4 & 0xffffffff] = (char *)0x0;
      _installedLocalesCount = iVar2;
      ucln_common_registerCleanup_63(UCLN_COMMON_ULOC,uloc_cleanup);
    }
  }
  ures_close_63(&installed);
  ures_close_63(resB);
  return;
}

Assistant:

static void U_CALLCONV loadInstalledLocales() {
    UResourceBundle *indexLocale = NULL;
    UResourceBundle installed;
    UErrorCode status = U_ZERO_ERROR;
    int32_t i = 0;
    int32_t localeCount;
    
    U_ASSERT(_installedLocales == NULL);
    U_ASSERT(_installedLocalesCount == 0);

    _installedLocalesCount = 0;
    ures_initStackObject(&installed);
    indexLocale = ures_openDirect(NULL, _kIndexLocaleName, &status);
    ures_getByKey(indexLocale, _kIndexTag, &installed, &status);
    
    if(U_SUCCESS(status)) {
        localeCount = ures_getSize(&installed);
        _installedLocales = (char **) uprv_malloc(sizeof(char*) * (localeCount+1));
        if (_installedLocales != NULL) {
            ures_resetIterator(&installed);
            while(ures_hasNext(&installed)) {
                ures_getNextString(&installed, NULL, (const char **)&_installedLocales[i++], &status);
            }
            _installedLocales[i] = NULL;
            _installedLocalesCount = localeCount;
            ucln_common_registerCleanup(UCLN_COMMON_ULOC, uloc_cleanup);
        }
    }
    ures_close(&installed);
    ures_close(indexLocale);
}